

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UppercaseSequance.cpp
# Opt level: O2

void __thiscall UppercaseSequance::~UppercaseSequance(UppercaseSequance *this)

{
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

UppercaseSequance::~UppercaseSequance(void)
{
	
}